

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

Value * choc::value::createObject(Value *__return_storage_ptr__,string_view className)

{
  Allocator *in_R8;
  string_view className_00;
  Type local_30;
  
  className_00._M_len = className._M_str;
  className_00._M_str = (char *)0x0;
  Type::createObject(&local_30,(Type *)className._M_len,className_00,in_R8);
  Value::Value(__return_storage_ptr__,&local_30);
  Type::deleteAllocatedObjects(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Value createObject (std::string_view className)
{
    return Value (Type::createObject (className));
}